

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O1

VectorU * anurbs::HilbertCurve<3L>::point_at(VectorU *__return_storage_ptr__,size_t m,size_t h)

{
  unsigned_long *puVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  byte bVar5;
  Index j;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  sbyte sVar9;
  ulong i;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ActualDstType actualDst;
  long lVar13;
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>).
  m_storage.m_data.array[0] = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>).
  m_storage.m_data.array[1] = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>).
  m_storage.m_data.array[2] = 0;
  if (-1 < (long)(m - 1)) {
    lVar12 = m * 3;
    uVar8 = 0;
    uVar11 = 0;
    lVar13 = m - 1;
    do {
      lVar12 = lVar12 + -3;
      lVar6 = 0;
      i = 0;
      do {
        i = i + ((ulong)((h >> ((ulong)(uint)((int)lVar6 + (int)lVar12) & 0x3f) & 1) != 0) <<
                ((byte)lVar6 & 0x3f));
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      sVar9 = (sbyte)(uVar11 + 1);
      if (uVar11 + 1 == 3) {
        sVar9 = 0;
      }
      uVar10 = i >> 1 ^ i ^
               (ulong)(((uint)(uVar8 >> sVar9) | (int)uVar8 << (3U - sVar9 & 0x1f)) & 7);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = 2 - uVar11;
      bVar5 = (char)(2 - uVar11) + SUB161(auVar3 * ZEXT816(0x5555555555555556),8) * -3;
      uVar7 = 0;
      do {
        puVar1 = (__return_storage_ptr__->
                 super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array + uVar7;
        *puVar1 = *puVar1 + ((ulong)(((((uint)(uVar10 >> (bVar5 & 0x3f)) |
                                       (int)uVar10 << ((bVar5 ^ 3) & 0x1f)) & 7) >> (uVar7 & 0x3f) &
                                     1) != 0) << ((byte)lVar13 & 0x3f));
        uVar7 = uVar7 + 1;
      } while (uVar7 != 3);
      uVar7 = 0;
      if (i != 0) {
        uVar7 = i - 1 >> 1 ^ i - 1 & 0xfffffffffffffffe;
      }
      uVar8 = uVar8 ^ ((uint)(uVar7 >> (3U - sVar9 & 0x3f)) | (uint)(uVar7 << sVar9)) & 7;
      sVar4 = d(i);
      uVar11 = (uVar11 + sVar4 + 1) % 3;
      bVar2 = 0 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static VectorU point_at(const size_t m, const size_t h) noexcept
    {
        // FIXME: check m

        size_t ve = 0;
        size_t vd = 0;

        VectorU p = VectorU::Zero();

        for (Index i = m - 1; i > -1; i--) {
            size_t w = 0;

            for (Index j = 0; j < TDimension; j++) {
                w += bit(h, i * TDimension + j) << j;
            }

            const size_t l = inverse_t(ve, vd, gc(w));

            for (Index j = 0; j < TDimension; j++) {
                p[j] += bit(l, j) << i;
            }

            ve = ve ^ rol(e(w), vd + 1);
            vd = (vd + d(w) + 1) % TDimension;
        }

        return p;
    }